

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_unix_util.c
# Opt level: O0

PaError PaUnixThread_NotifyParent(PaUnixThread *self)

{
  PaError local_14;
  PaError result;
  PaUnixThread *self_local;
  
  local_14 = 0;
  if (self->parentWaiting == 0) {
    PaUtil_DebugPrint(
                     "Expression \'self->parentWaiting\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/os/unix/pa_unix_util.c\', line: 479\n"
                     );
    local_14 = -0x2702;
  }
  else {
    if (self->locked == 0) {
      paUtilErr_ = PaUnixMutex_Lock(&self->mtx);
      if (paUtilErr_ < 0) {
        PaUtil_DebugPrint(
                         "Expression \'PaUnixMutex_Lock( &self->mtx )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/os/unix/pa_unix_util.c\', line: 483\n"
                         );
        return paUtilErr_;
      }
      self->locked = 1;
    }
    self->parentWaiting = 0;
    pthread_cond_signal((pthread_cond_t *)&self->cond);
    paUtilErr_ = PaUnixMutex_Unlock(&self->mtx);
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'PaUnixMutex_Unlock( &self->mtx )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/os/unix/pa_unix_util.c\', line: 488\n"
                       );
      local_14 = paUtilErr_;
    }
    else {
      self->locked = 0;
    }
  }
  return local_14;
}

Assistant:

PaError PaUnixThread_NotifyParent( PaUnixThread* self )
{
    PaError result = paNoError;
    PA_UNLESS( self->parentWaiting, paInternalError );

    if( !self->locked )
    {
        PA_ENSURE( PaUnixMutex_Lock( &self->mtx ) );
        self->locked = 1;
    }
    self->parentWaiting = 0;
    pthread_cond_signal( &self->cond );
    PA_ENSURE( PaUnixMutex_Unlock( &self->mtx ) );
    self->locked = 0;

error:
    return result;
}